

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherLinux.cpp
# Opt level: O3

void __thiscall FW::FileWatcherLinux::update(FileWatcherLinux *this)

{
  __fd_mask *p_Var1;
  uint __fd;
  mapped_type pWVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ssize_t sVar6;
  mapped_type *ppWVar7;
  long lVar8;
  char buff [4210688];
  undefined1 *in_stack_ffffffffffbfbf98;
  long in_stack_ffffffffffbfbfa8;
  
  iVar4 = this->mFD;
  iVar3 = iVar4 + 0x3f;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  p_Var1 = (this->mDescriptorSet).fds_bits + (iVar3 >> 6);
  *p_Var1 = *p_Var1 | 1L << ((byte)(iVar4 % 0x40) & 0x3f);
  iVar4 = select(iVar4 + 1,(fd_set *)&this->mDescriptorSet,(fd_set *)0x0,(fd_set *)0x0,
                 (timeval *)&this->mTimeOut);
  if (-1 < iVar4) {
    __fd = this->mFD;
    uVar5 = __fd + 0x3f;
    if (-1 < (int)__fd) {
      uVar5 = __fd;
    }
    if (((ulong)(this->mDescriptorSet).fds_bits[(int)uVar5 >> 6] >> ((ulong)__fd & 0x3f) & 1) != 0)
    {
      memset(&stack0xffffffffffbfbfc8,0,0x404000);
      sVar6 = read(__fd,&stack0xffffffffffbfbfc8,0x404000);
      if (0 < sVar6) {
        lVar8 = 0;
        do {
          ppWVar7 = std::
                    map<unsigned_long,_FW::WatchStruct_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FW::WatchStruct_*>_>_>
                    ::operator[](&this->mWatches,(key_type *)&stack0xffffffffffbfbf90);
          pWVar2 = *ppWVar7;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xffffffffffbfbf98,&stack0xffffffffffbfbfd8 + lVar8,
                     (allocator<char> *)&stack0xffffffffffbfbf8f);
          (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                    (this,pWVar2,&stack0xffffffffffbfbf90,
                     (ulong)*(uint *)(&stack0xffffffffffbfbfcc + lVar8));
          if (in_stack_ffffffffffbfbf98 != &stack0xffffffffffbfbfa8) {
            operator_delete(in_stack_ffffffffffbfbf98,in_stack_ffffffffffbfbfa8 + 1);
          }
          lVar8 = lVar8 + (ulong)*(uint *)(&stack0xffffffffffbfbfd4 + lVar8) + 0x10;
        } while (lVar8 < sVar6);
      }
    }
    return;
  }
  perror("select");
  return;
}

Assistant:

void FileWatcherLinux::update()
	{
		FD_SET(mFD, &mDescriptorSet);

		int ret = select(mFD + 1, &mDescriptorSet, NULL, NULL, &mTimeOut);
		if(ret < 0)
		{
			perror("select");
		}
		else if(FD_ISSET(mFD, &mDescriptorSet))
		{
			ssize_t len, i = 0;
			//char action[81+FILENAME_MAX] = {0};
			char buff[BUFF_SIZE] = {0};

			len = read (mFD, buff, BUFF_SIZE);
		   
			while (i < len)
			{
				struct inotify_event *pevent = (struct inotify_event *)&buff[i];

				WatchStruct* watch = mWatches[pevent->wd];
				handleAction(watch, pevent->name, pevent->mask);
				i += sizeof(struct inotify_event) + pevent->len;
			}
		}
	}